

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_soc.cpp
# Opt level: O0

MppDecHwCap * mpp_get_dec_hw_info_by_client_type(MppClientType client_type)

{
  MppSocInfo *pMVar1;
  uint local_24;
  RK_U32 i;
  MppSocInfo *info;
  MppDecHwCap *hw_info;
  MppClientType client_type_local;
  
  pMVar1 = mpp_get_soc_info();
  local_24 = 0;
  while( true ) {
    if (5 < local_24) {
      return (MppDecHwCap *)0x0;
    }
    if ((pMVar1->dec_caps[local_24] != (MppDecHwCap *)0x0) &&
       (((MppClientType)*(undefined8 *)&pMVar1->dec_caps[local_24]->field_0x4 & 0xff) == client_type
       )) break;
    local_24 = local_24 + 1;
  }
  return pMVar1->dec_caps[local_24];
}

Assistant:

const MppDecHwCap* mpp_get_dec_hw_info_by_client_type(MppClientType client_type)
{
    const MppDecHwCap* hw_info = NULL;
    const MppSocInfo *info = mpp_get_soc_info();
    RK_U32 i = 0;

    for (i = 0; i < MPP_ARRAY_ELEMS(info->dec_caps); i++) {
        if (info->dec_caps[i] && info->dec_caps[i]->type == client_type) {
            hw_info = info->dec_caps[i];
            break;
        }
    }

    return hw_info;
}